

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O0

void __thiscall PSEngine::load_level_internal(PSEngine *this,int p_level_idx)

{
  int iVar1;
  reference this_00;
  bool bVar2;
  size_type sVar3;
  element_type *peVar4;
  reference pvVar5;
  ulong uVar6;
  reference pvVar7;
  reference pwVar8;
  ObjectMoveType local_204;
  shared_ptr<CompiledGame::PrimaryObject> local_200;
  pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType> local_1f0;
  undefined1 local_1d8 [8];
  weak_ptr<CompiledGame::PrimaryObject> obj;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
  *__range2;
  Cell local_1a8;
  reference local_170;
  value_type *cell;
  PSVector2i PStack_160;
  int i;
  Level local_158;
  undefined1 local_128 [8];
  Level compiled_level;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [36];
  int local_14;
  PSEngine *pPStack_10;
  int p_level_idx_local;
  PSEngine *this_local;
  
  local_14 = p_level_idx;
  pPStack_10 = this;
  sVar3 = std::vector<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>::size
                    (&(this->m_compiled_game).levels);
  if ((ulong)(long)p_level_idx < sVar3) {
    std::vector<PSEngine::Level,_std::allocator<PSEngine::Level>_>::clear
              (&this->m_level_state_stack);
    this->m_is_level_won = false;
    this->m_current_tick_time_elapsed = 0.0;
    pvVar5 = std::vector<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>::operator[]
                       (&(this->m_compiled_game).levels,(long)local_14);
    CompiledGame::Level::Level((Level *)local_128,pvVar5);
    local_158.cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_158.level_idx = 0;
    local_158.size.x = 0;
    local_158.size.y = 0;
    local_158._12_4_ = 0;
    local_158.cells.super__Vector_base<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Level::Level(&local_158);
    Level::operator=(&this->m_current_level,&local_158);
    Level::~Level(&local_158);
    (this->m_current_level).level_idx = local_14;
    PSVector2i::PSVector2i(&stack0xfffffffffffffea0,local_128._0_4_,local_128._4_4_);
    (this->m_current_level).size = PStack_160;
    for (cell._4_4_ = 0; uVar6 = (ulong)cell._4_4_,
        sVar3 = std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::size
                          ((vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_> *)
                           &compiled_level), uVar6 < sVar3; cell._4_4_ = cell._4_4_ + 1) {
      local_170 = std::vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>::operator[]
                            ((vector<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_> *)
                             &compiled_level,(long)cell._4_4_);
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1a8.position.x = 0;
      local_1a8.position.y = 0;
      local_1a8.objects._M_t._M_impl._0_8_ = 0;
      local_1a8.objects._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      Cell::Cell(&local_1a8);
      std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::push_back
                (&(this->m_current_level).cells,&local_1a8);
      Cell::~Cell(&local_1a8);
      iVar1 = (this->m_current_level).size.x;
      PSVector2i::PSVector2i((PSVector2i *)&__range2,cell._4_4_ % iVar1,cell._4_4_ / iVar1);
      pvVar7 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::back
                         (&(this->m_current_level).cells);
      this_00 = local_170;
      pvVar7->position = (PSVector2i)__range2;
      __end2 = std::
               vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
               ::begin(&local_170->objects);
      obj.super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>
              ::end(&this_00->objects);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_std::weak_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>_>
                                         *)&obj.
                                            super___weak_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar2) {
        pwVar8 = __gnu_cxx::
                 __normal_iterator<const_std::weak_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>_>
                 ::operator*(&__end2);
        std::weak_ptr<CompiledGame::PrimaryObject>::weak_ptr
                  ((weak_ptr<CompiledGame::PrimaryObject> *)local_1d8,pwVar8);
        pvVar7 = std::vector<PSEngine::Cell,_std::allocator<PSEngine::Cell>_>::back
                           (&(this->m_current_level).cells);
        std::weak_ptr<CompiledGame::PrimaryObject>::lock
                  ((weak_ptr<CompiledGame::PrimaryObject> *)&local_200);
        local_204 = Stationary;
        std::make_pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>
                  (&local_1f0,&local_200,&local_204);
        std::
        map<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
        ::insert<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType>>
                  ((map<std::shared_ptr<CompiledGame::PrimaryObject>,PSEngine::ObjectMoveType,std::less<std::shared_ptr<CompiledGame::PrimaryObject>>,std::allocator<std::pair<std::shared_ptr<CompiledGame::PrimaryObject>const,PSEngine::ObjectMoveType>>>
                    *)&pvVar7->objects,&local_1f0);
        std::pair<std::shared_ptr<CompiledGame::PrimaryObject>,_PSEngine::ObjectMoveType>::~pair
                  (&local_1f0);
        std::shared_ptr<CompiledGame::PrimaryObject>::~shared_ptr(&local_200);
        std::weak_ptr<CompiledGame::PrimaryObject>::~weak_ptr
                  ((weak_ptr<CompiledGame::PrimaryObject> *)local_1d8);
        __gnu_cxx::
        __normal_iterator<const_std::weak_ptr<CompiledGame::PrimaryObject>_*,_std::vector<std::weak_ptr<CompiledGame::PrimaryObject>,_std::allocator<std::weak_ptr<CompiledGame::PrimaryObject>_>_>_>
        ::operator++(&__end2);
      }
    }
    CompiledGame::Level::~Level((Level *)local_128);
  }
  else if ((int)(this->m_config).log_verbosity < 5) {
    peVar4 = std::__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<PSLogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->m_logger);
    std::__cxx11::string::string(local_38,(string *)&m_engine_log_cat_abi_cxx11_);
    std::__cxx11::to_string(&local_d8,local_14);
    std::operator+(&local_b8,"Cannot load level ",&local_d8);
    std::operator+(&local_98,&local_b8,", there\'s only ");
    sVar3 = std::vector<CompiledGame::Level,_std::allocator<CompiledGame::Level>_>::size
                      (&(this->m_compiled_game).levels);
    std::__cxx11::to_string
              ((string *)
               &compiled_level.cells.
                super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar3);
    std::operator+(&local_78,&local_98,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &compiled_level.cells.
                    super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_58,&local_78," levels.");
    (*peVar4->_vptr_PSLogger[2])(peVar4,4,local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string
              ((string *)
               &compiled_level.cells.
                super__Vector_base<CompiledGame::Cell,_std::allocator<CompiledGame::Cell>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string(local_38);
    if (((this->m_config).log_operation_history_after_error & 1U) != 0) {
      print_operation_history(this);
    }
  }
  return;
}

Assistant:

void PSEngine::load_level_internal(int p_level_idx)
{
    if(p_level_idx >= m_compiled_game.levels.size())
    {
        PS_LOG_ERROR("Cannot load level "+to_string(p_level_idx)+", there's only "+to_string(m_compiled_game.levels.size())+" levels.");
        return;
    }
    m_level_state_stack.clear();
    m_is_level_won = false;
    m_current_tick_time_elapsed = 0;

    CompiledGame::Level compiled_level = m_compiled_game.levels[p_level_idx];

    m_current_level = Level();

    m_current_level.level_idx = p_level_idx;
    m_current_level.size = PSVector2i(compiled_level.width, compiled_level.height);


    for(int i = 0; i < compiled_level.cells.size(); ++i)
    {
        const auto& cell = compiled_level.cells[i];

        m_current_level.cells.push_back(Cell());

        m_current_level.cells.back().position = PSVector2i( i % m_current_level.size.x, i / m_current_level.size.x);

        for(weak_ptr<CompiledGame::PrimaryObject> obj : cell.objects)
        {
            m_current_level.cells.back().objects.insert(make_pair(obj.lock(),ObjectMoveType::Stationary));
        }
    }
}